

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.cc
# Opt level: O0

void __thiscall trng::mrg5s::mrg5s(mrg5s *this,unsigned_long s,parameter_type *P)

{
  undefined8 *in_RDX;
  unsigned_long in_RSI;
  mrg5s *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = *in_RDX;
  *(undefined8 *)((in_RDI->P).a + 2) = in_RDX[1];
  (in_RDI->P).a[4] = *(int *)(in_RDX + 2);
  mrg_status<int,_5,_trng::mrg5s>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

mrg5s::mrg5s(unsigned long s, const mrg5s::parameter_type &P) : P{P} { seed(s); }